

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureHandler.cxx
# Opt level: O1

int __thiscall cmCTestConfigureHandler::ProcessHandler(cmCTestConfigureHandler *this)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  cmCTest *pcVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  ostream *poVar7;
  int iVar8;
  int retVal;
  string cCommand;
  cmXMLWriter xml;
  string output;
  time_point start_time_time;
  string buildDirectory;
  ostringstream cmCTestLog_msg_5;
  string start_time;
  ostringstream cmCTestLog_msg;
  cmGeneratedFileStream ofs;
  int local_784;
  string local_780;
  string local_760;
  undefined1 local_740 [88];
  string local_6e8;
  long local_6c8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_6c0;
  string local_6b8;
  undefined1 local_698 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688 [6];
  ios_base local_628 [264];
  string local_520;
  undefined1 local_500 [32];
  byte abStack_4e0 [80];
  ios_base local_490 [504];
  undefined1 local_298 [16];
  _func_int *local_288 [2];
  byte abStack_278 [80];
  ios_base local_228 [504];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_500,"Configure project",0x11);
  std::ios::widen((char)*(undefined8 *)(local_500._0_8_ + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
               ,0x1a,(char *)local_298._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((_func_int **)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
  std::ios_base::~ios_base(local_490);
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_500 + 0x10;
  local_500._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"ConfigureCommand","");
  cmCTest::GetCTestConfiguration(&local_760,pcVar3,(string *)local_500);
  if ((pointer)local_500._0_8_ != pcVar1) {
    operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
  }
  if (local_760._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_500,"Cannot find ConfigureCommand key in the DartConfiguration.tcl",
               0x3d);
    std::ios::widen((char)*(undefined8 *)(local_500._0_8_ + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x20,(char *)local_298._0_8_,false);
    if ((_func_int **)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
    std::ios_base::~ios_base(local_490);
    iVar8 = -1;
    goto LAB_001c6a81;
  }
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  local_500._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_6b8,pcVar3,(string *)local_500);
  if ((pointer)local_500._0_8_ != pcVar1) {
    operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
  }
  if (local_6b8._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_500,"Cannot find BuildDirectory  key in the DartConfiguration.tcl",
               0x3c);
    std::ios::widen((char)*(undefined8 *)(local_500._0_8_ + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x29,(char *)local_298._0_8_,false);
    if ((_func_int **)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
    std::ios_base::~ios_base(local_490);
    iVar8 = -1;
  }
  else {
    lVar6 = std::chrono::_V2::steady_clock::now();
    local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
    local_6e8._M_string_length = 0;
    local_6e8.field_2._M_local_buf[0] = '\0';
    local_784 = 0;
    bVar4 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_500,"Configure with command: ",0x18);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_500,local_760._M_dataplus._M_p,local_760._M_string_length
                         );
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x5f,(char *)local_298._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((_func_int **)local_298._0_8_ != local_288) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
      std::ios_base::~ios_base(local_490);
      bVar5 = false;
LAB_001c694d:
      if ((bVar5 == false) || (iVar8 = 0, local_784 != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_500,"Error(s) when configuring the project",0x25);
        std::ios::widen((char)*(undefined8 *)(local_500._0_8_ + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,99,(char *)local_298._0_8_,false);
        if ((_func_int **)local_298._0_8_ != local_288) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
        std::ios_base::~ios_base(local_490);
        iVar8 = -1;
      }
    }
    else {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_500,None);
      bVar4 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartConfigure,"Configure",
                         (cmGeneratedFileStream *)local_500);
      if (bVar4) {
        cmCTest::CurrentTime_abi_cxx11_(&local_520,(this->super_cmCTestGenericHandler).CTest);
        local_6c0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
        cmCTestGenericHandler::StartLogFile
                  (&this->super_cmCTestGenericHandler,"Configure",(cmGeneratedFileStream *)local_298
                  );
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_698,"Configure with command: ",0x18);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_698,local_760._M_dataplus._M_p,
                            local_760._M_string_length);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x3f,(char *)local_740._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((ostream *)local_740._0_8_ != (ostream *)(local_740 + 0x10)) {
          operator_delete((void *)local_740._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_740._16_8_)->_M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
        std::ios_base::~ios_base(local_628);
        bVar5 = cmCTest::RunMakeCommand
                          ((this->super_cmCTestGenericHandler).CTest,&local_760,&local_6e8,
                           &local_784,local_6b8._M_dataplus._M_p,(cmDuration)0x0,
                           (ostream *)local_298,Auto);
        if ((abStack_278[(long)*(_func_int **)(local_298._0_8_ + -0x18)] & 5) == 0) {
          std::ofstream::close();
        }
        if ((abStack_4e0[*(long *)(local_500._0_8_ + -0x18)] & 5) == 0) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_740,(ostream *)local_500,0);
          local_6c8 = lVar6;
          cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_740,
                            (this->super_cmCTestGenericHandler).AppendXML);
          cmCTest::GenerateSubprojectsOutput
                    ((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_740);
          pp_Var2 = (_func_int **)(local_698 + 0x10);
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"Configure","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_740,(string *)local_698);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"StartDateTime","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_740,(string *)local_698);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_740,&local_520);
          cmXMLWriter::EndElement((cmXMLWriter *)local_740);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_698,"StartConfigureTime","");
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_740,(string *)local_698,&local_6c0);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"ConfigureCommand","")
          ;
          cmXMLWriter::StartElement((cmXMLWriter *)local_740,(string *)local_698);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_740,&local_760);
          cmXMLWriter::EndElement((cmXMLWriter *)local_740);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_698,"End",3);
          std::ios::widen((char)(ostream *)local_698 +
                          (char)*(_func_int **)(local_698._0_8_ + -0x18));
          std::ostream::put((char)local_698);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                       ,0x50,local_780._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_780._M_dataplus._M_p != &local_780.field_2) {
            operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
          std::ios_base::~ios_base(local_628);
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"Log","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_740,(string *)local_698);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_740,&local_6e8);
          cmXMLWriter::EndElement((cmXMLWriter *)local_740);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"ConfigureStatus","");
          cmXMLWriter::Element<int>((cmXMLWriter *)local_740,(string *)local_698,&local_784);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"EndDateTime","");
          cmCTest::CurrentTime_abi_cxx11_(&local_780,(this->super_cmCTestGenericHandler).CTest);
          cmXMLWriter::StartElement((cmXMLWriter *)local_740,(string *)local_698);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_740,&local_780);
          cmXMLWriter::EndElement((cmXMLWriter *)local_740);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_780._M_dataplus._M_p != &local_780.field_2) {
            operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
          }
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"EndConfigureTime","")
          ;
          local_780._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_740,(string *)local_698,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&local_780);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"ElapsedMinutes","");
          lVar6 = std::chrono::_V2::steady_clock::now();
          local_780._M_dataplus._M_p = (pointer)((lVar6 - local_6c8) / 60000000000);
          cmXMLWriter::Element<long>
                    ((cmXMLWriter *)local_740,(string *)local_698,(long *)&local_780);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          cmXMLWriter::EndElement((cmXMLWriter *)local_740);
          cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_740);
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_740);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"Cannot open configure file",0x1a);
        std::ios::widen((char)(ostream *)local_298 + (char)*(_func_int **)(local_298._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_298);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x35,(char *)local_698._0_8_,false);
        if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
          operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
        std::ios_base::~ios_base(local_228);
        bVar5 = false;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_500);
      iVar8 = 1;
      if (bVar4) goto LAB_001c694d;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
      operator_delete(local_6e8._M_dataplus._M_p,
                      CONCAT71(local_6e8.field_2._M_allocated_capacity._1_7_,
                               local_6e8.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
LAB_001c6a81:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  return iVar8;
}

Assistant:

int cmCTestConfigureHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Configure project" << std::endl, this->Quiet);
  std::string cCommand =
    this->CTest->GetCTestConfiguration("ConfigureCommand");
  if (cCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find ConfigureCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  auto elapsed_time_start = std::chrono::steady_clock::now();
  std::string output;
  int retVal = 0;
  bool res = false;
  if (!this->CTest->GetShowOnly()) {
    cmGeneratedFileStream os;
    if (!this->StartResultingXML(cmCTest::PartConfigure, "Configure", os)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open configure file" << std::endl);
      return 1;
    }
    std::string start_time = this->CTest->CurrentTime();
    auto start_time_time = std::chrono::system_clock::now();

    cmGeneratedFileStream ofs;
    this->StartLogFile("Configure", ofs);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
    res = this->CTest->RunMakeCommand(cCommand, output, &retVal,
                                      buildDirectory.c_str(),
                                      cmDuration::zero(), ofs);

    if (ofs) {
      ofs.close();
    }

    if (os) {
      cmXMLWriter xml(os);
      this->CTest->StartXML(xml, this->AppendXML);
      this->CTest->GenerateSubprojectsOutput(xml);
      xml.StartElement("Configure");
      xml.Element("StartDateTime", start_time);
      xml.Element("StartConfigureTime", start_time_time);
      xml.Element("ConfigureCommand", cCommand);
      cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
      xml.Element("Log", output);
      xml.Element("ConfigureStatus", retVal);
      xml.Element("EndDateTime", this->CTest->CurrentTime());
      xml.Element("EndConfigureTime", std::chrono::system_clock::now());
      xml.Element("ElapsedMinutes",
                  std::chrono::duration_cast<std::chrono::minutes>(
                    std::chrono::steady_clock::now() - elapsed_time_start)
                    .count());
      xml.EndElement(); // Configure
      this->CTest->EndXML(xml);
    }
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
  }
  if (!res || retVal) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when configuring the project" << std::endl);
    return -1;
  }
  return 0;
}